

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O3

void __thiscall
density::detail::LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false>::LifoArrayImpl
          (LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false> *this,size_t i_element_count)

{
  void *new_block;
  TestObject<1UL,_1UL> *pTVar1;
  unsigned_long mem_size;
  ulong i_size;
  long *in_FS_OFFSET;
  
  i_size = i_element_count + 7 & 0xfffffffffffffff8;
  ThreadLifoAllocator<0>::s_allocator::__tls_init();
  pTVar1 = (TestObject<1UL,_1UL> *)in_FS_OFFSET[-0x19];
  if ((TestObject<1UL,_1UL> *)&DAT_0000ffef <
      pTVar1 + i_size + -((ulong)pTVar1 & 0xffffffffffff0000)) {
    pTVar1 = (TestObject<1UL,_1UL> *)
             lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::allocate_slow_path
                       ((lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *)
                        (*in_FS_OFFSET + -200),i_size);
  }
  else {
    in_FS_OFFSET[-0x19] = (long)(pTVar1 + i_size);
  }
  this->m_elements = pTVar1;
  this->m_size = i_element_count;
  return;
}

Assistant:

LifoArrayImpl(size_t i_element_count)
                : m_elements(static_cast<TYPE *>(
                    detail::ThreadLifoAllocator<>::allocate(compute_mem_size(i_element_count)))),
                  m_size(i_element_count)
            {
            }